

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O0

void __thiscall mario::EPoller::~EPoller(EPoller *this)

{
  EPoller *this_local;
  
  close(this->_epollfd);
  std::
  map<int,_mario::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_mario::Channel_*>_>_>
  ::~map(&this->_channels);
  std::vector<epoll_event,_std::allocator<epoll_event>_>::~vector(&this->_events);
  return;
}

Assistant:

EPoller::~EPoller() {
    ::close(_epollfd);
}